

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O3

int emit_dqt(j_compress_ptr cinfo,int index)

{
  UINT16 *pUVar1;
  ushort uVar2;
  JQUANT_TBL *pJVar3;
  jpeg_error_mgr *pjVar4;
  long lVar5;
  char cVar6;
  undefined4 unaff_R13D;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  pJVar3 = cinfo->quant_tbl_ptrs[index];
  if (pJVar3 == (JQUANT_TBL *)0x0) {
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0x34;
    (pjVar4->msg_parm).i[0] = index;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  auVar8 = (undefined1  [16])0x0;
  lVar5 = 0;
  do {
    pUVar1 = pJVar3->quantval + lVar5;
    auVar10._0_2_ = -(ushort)(-0x7f01 < (short)(*pUVar1 ^ 0x8000));
    auVar10._2_2_ = 0;
    auVar10._4_2_ = -(ushort)(-0x7f01 < (short)(pUVar1[1] ^ 0x8000));
    auVar10._6_2_ = -(ushort)(-0x7f01 < (short)(pUVar1[1] ^ 0x8000));
    auVar10._8_2_ = -(ushort)(-0x7f01 < (short)(pUVar1[2] ^ 0x8000));
    auVar10._10_2_ = 0xffff;
    auVar10._12_2_ = -(ushort)(-0x7f01 < (short)(pUVar1[3] ^ 0x8000));
    auVar10._14_2_ = -(ushort)(-0x7f01 < (short)(pUVar1[3] ^ 0x8000));
    auVar8 = auVar8 | auVar10;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x40);
  auVar9._0_4_ = auVar8._0_4_ << 0x1f;
  auVar9._4_4_ = auVar8._4_4_ << 0x1f;
  auVar9._8_4_ = auVar8._8_4_ << 0x1f;
  auVar9._12_4_ = auVar8._12_4_ << 0x1f;
  uVar7 = movmskps(unaff_R13D,auVar9);
  cVar6 = (char)uVar7;
  if (pJVar3->sent_table == 0) {
    emit_byte(cinfo,0xff);
    emit_byte(cinfo,0xdb);
    lVar5 = 0;
    emit_byte(cinfo,0);
    emit_byte(cinfo,(uint)(cVar6 != '\0') * 0x40 + 0x43);
    emit_byte(cinfo,(uint)(cVar6 != '\0') * 0x10 + index);
    do {
      uVar2 = pJVar3->quantval[jpeg_natural_order[lVar5]];
      if (cVar6 != '\0') {
        emit_byte(cinfo,(uint)(uVar2 >> 8));
      }
      emit_byte(cinfo,uVar2 & 0xff);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x40);
    pJVar3->sent_table = 1;
  }
  return (int)(cVar6 != '\0');
}

Assistant:

LOCAL(int)
emit_dqt(j_compress_ptr cinfo, int index)
/* Emit a DQT marker */
/* Returns the precision used (0 = 8bits, 1 = 16bits) for baseline checking */
{
  JQUANT_TBL *qtbl = cinfo->quant_tbl_ptrs[index];
  int prec;
  int i;

  if (qtbl == NULL)
    ERREXIT1(cinfo, JERR_NO_QUANT_TABLE, index);

  prec = 0;
  for (i = 0; i < DCTSIZE2; i++) {
    if (qtbl->quantval[i] > 255)
      prec = 1;
  }

  if (!qtbl->sent_table) {
    emit_marker(cinfo, M_DQT);

    emit_2bytes(cinfo, prec ? DCTSIZE2 * 2 + 1 + 2 : DCTSIZE2 + 1 + 2);

    emit_byte(cinfo, index + (prec << 4));

    for (i = 0; i < DCTSIZE2; i++) {
      /* The table entries must be emitted in zigzag order. */
      unsigned int qval = qtbl->quantval[jpeg_natural_order[i]];
      if (prec)
        emit_byte(cinfo, (int)(qval >> 8));
      emit_byte(cinfo, (int)(qval & 0xFF));
    }

    qtbl->sent_table = TRUE;
  }

  return prec;
}